

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1da1d1::PODSmallVector<(anonymous_namespace)::ForwardTemplateReference_*,_4UL>::
reserve(PODSmallVector<(anonymous_namespace)::ForwardTemplateReference_*,_4UL> *this,size_t NewCap)

{
  bool bVar1;
  size_t sVar2;
  ForwardTemplateReference **ppFVar3;
  ForwardTemplateReference **Tmp;
  size_t S;
  size_t NewCap_local;
  PODSmallVector<(anonymous_namespace)::ForwardTemplateReference_*,_4UL> *this_local;
  
  sVar2 = size(this);
  bVar1 = isInline(this);
  if (bVar1) {
    ppFVar3 = (ForwardTemplateReference **)malloc(NewCap << 3);
    if (ppFVar3 == (ForwardTemplateReference **)0x0) {
      std::terminate();
    }
    std::
    copy<(anonymous_namespace)::ForwardTemplateReference**,(anonymous_namespace)::ForwardTemplateReference**>
              (this->First,this->Last,ppFVar3);
    this->First = ppFVar3;
  }
  else {
    ppFVar3 = (ForwardTemplateReference **)realloc(this->First,NewCap << 3);
    this->First = ppFVar3;
    if (this->First == (ForwardTemplateReference **)0x0) {
      std::terminate();
    }
  }
  this->Last = this->First + sVar2;
  this->Cap = this->First + NewCap;
  return;
}

Assistant:

void reserve(size_t NewCap) {
    size_t S = size();
    if (isInline()) {
      auto* Tmp = static_cast<T*>(std::malloc(NewCap * sizeof(T)));
      if (Tmp == nullptr)
        std::terminate();
      std::copy(First, Last, Tmp);
      First = Tmp;
    } else {
      First = static_cast<T*>(std::realloc(First, NewCap * sizeof(T)));
      if (First == nullptr)
        std::terminate();
    }
    Last = First + S;
    Cap = First + NewCap;
  }